

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int verify_sign(void *verify_ctx,uint16_t algo,ptls_iovec_t data,ptls_iovec_t signature)

{
  EVP_PKEY_CTX *pEVar1;
  int iVar2;
  int iVar3;
  ptls_openssl_signature_scheme_t *ppVar4;
  EVP_MD_CTX *ctx;
  EVP_MD *type;
  EVP_MD *pEVar5;
  uint8_t *puVar6;
  _func_EVP_MD_ptr **pp_Var7;
  EVP_PKEY_CTX *pkey_ctx;
  size_t local_48;
  uint8_t *local_40;
  EVP_MD_CTX *local_38;
  
  puVar6 = data.base;
  pkey_ctx = (EVP_PKEY_CTX *)0x0;
  if (puVar6 == (uint8_t *)0x0) {
    iVar2 = 0;
  }
  else {
    local_40 = signature.base;
    ppVar4 = ptls_openssl_lookup_signature_schemes((EVP_PKEY *)verify_ctx);
    if (ppVar4 == (ptls_openssl_signature_scheme_t *)0x0) {
      iVar2 = 0x203;
    }
    else {
      iVar2 = 0x2f;
      for (pp_Var7 = &ppVar4->scheme_md; local_48 = signature.len,
          ((ptls_openssl_signature_scheme_t *)(pp_Var7 + -1))->scheme_id != 0xffff;
          pp_Var7 = pp_Var7 + 2) {
        if (((ptls_openssl_signature_scheme_t *)(pp_Var7 + -1))->scheme_id == algo) {
          ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
          if (ctx == (EVP_MD_CTX *)0x0) {
            iVar2 = 0x201;
          }
          else {
            iVar2 = EVP_PKEY_get_id(verify_ctx);
            if (iVar2 == 0x43f) {
              iVar3 = EVP_DigestVerifyInit
                                (ctx,(EVP_PKEY_CTX **)&pkey_ctx,(EVP_MD *)0x0,(ENGINE *)0x0,
                                 (EVP_PKEY *)verify_ctx);
              iVar2 = 0x203;
              if ((iVar3 == 1) &&
                 (iVar3 = EVP_DigestVerify(ctx,local_40,local_48,puVar6,data.len), iVar3 == 1)) {
LAB_0010c42f:
                iVar2 = 0;
              }
            }
            else {
              type = (EVP_MD *)(**pp_Var7)();
              iVar3 = EVP_DigestVerifyInit
                                (ctx,(EVP_PKEY_CTX **)&pkey_ctx,type,(ENGINE *)0x0,
                                 (EVP_PKEY *)verify_ctx);
              iVar2 = 0x203;
              if (iVar3 == 1) {
                iVar3 = EVP_PKEY_get_id(verify_ctx);
                if (iVar3 == 6) {
                  iVar3 = EVP_PKEY_CTX_set_rsa_padding(pkey_ctx,6);
                  if ((iVar3 == 1) &&
                     (iVar3 = EVP_PKEY_CTX_set_rsa_pss_saltlen(pkey_ctx,0xffffffffffffffff),
                     pEVar1 = pkey_ctx, iVar3 == 1)) {
                    local_38 = ctx;
                    pEVar5 = (**pp_Var7)();
                    ctx = local_38;
                    iVar3 = EVP_PKEY_CTX_set_rsa_mgf1_md(pEVar1,pEVar5);
                    if (iVar3 == 1) goto LAB_0010c405;
                  }
                }
                else {
LAB_0010c405:
                  iVar3 = EVP_DigestVerifyUpdate(ctx,puVar6,data.len);
                  if (iVar3 == 1) {
                    iVar2 = EVP_DigestVerifyFinal(ctx,local_40,local_48);
                    if (iVar2 == 1) goto LAB_0010c42f;
                    iVar2 = 0x33;
                  }
                }
              }
            }
            EVP_MD_CTX_free(ctx);
          }
          break;
        }
      }
    }
  }
  EVP_PKEY_free((EVP_PKEY *)verify_ctx);
  return iVar2;
}

Assistant:

static int verify_sign(void *verify_ctx, uint16_t algo, ptls_iovec_t data, ptls_iovec_t signature)
{
    EVP_PKEY *key = verify_ctx;
    const ptls_openssl_signature_scheme_t *scheme;
    EVP_MD_CTX *ctx = NULL;
    EVP_PKEY_CTX *pkey_ctx = NULL;
    int ret = 0;

    if (data.base == NULL)
        goto Exit;

    if ((scheme = ptls_openssl_lookup_signature_schemes(key)) == NULL) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    for (; scheme->scheme_id != UINT16_MAX; ++scheme)
        if (scheme->scheme_id == algo)
            goto SchemeFound;
    ret = PTLS_ALERT_ILLEGAL_PARAMETER;
    goto Exit;

SchemeFound:
    if ((ctx = EVP_MD_CTX_create()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

#if PTLS_OPENSSL_HAVE_ED25519
    if (EVP_PKEY_id(key) == EVP_PKEY_ED25519) {
        /* ED25519 requires the use of the all-at-once function that appeared in OpenSSL 1.1.1, hence different path */
        if (EVP_DigestVerifyInit(ctx, &pkey_ctx, NULL, NULL, key) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        if (EVP_DigestVerify(ctx, signature.base, signature.len, data.base, data.len) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
    } else
#endif
    {
        if (EVP_DigestVerifyInit(ctx, &pkey_ctx, scheme->scheme_md(), NULL, key) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }

        if (EVP_PKEY_id(key) == EVP_PKEY_RSA) {
            if (EVP_PKEY_CTX_set_rsa_padding(pkey_ctx, RSA_PKCS1_PSS_PADDING) != 1) {
                ret = PTLS_ERROR_LIBRARY;
                goto Exit;
            }
            if (EVP_PKEY_CTX_set_rsa_pss_saltlen(pkey_ctx, -1) != 1) {
                ret = PTLS_ERROR_LIBRARY;
                goto Exit;
            }
            if (EVP_PKEY_CTX_set_rsa_mgf1_md(pkey_ctx, scheme->scheme_md()) != 1) {
                ret = PTLS_ERROR_LIBRARY;
                goto Exit;
            }
        }
        if (EVP_DigestVerifyUpdate(ctx, data.base, data.len) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        if (EVP_DigestVerifyFinal(ctx, signature.base, signature.len) != 1) {
            ret = PTLS_ALERT_DECRYPT_ERROR;
            goto Exit;
        }
    }

    ret = 0;

Exit:
    if (ctx != NULL)
        EVP_MD_CTX_destroy(ctx);
    EVP_PKEY_free(key);
    return ret;
}